

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseStringName(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  int iVar1;
  int iVar2;
  long lVar3;
  xmlChar *__dest;
  xmlChar *pxVar4;
  uint uVar5;
  int iVar6;
  ulong __n;
  xmlChar *pxVar7;
  int l;
  ulong local_b8;
  xmlChar **local_b0;
  xmlChar buf [105];
  
  pxVar7 = *str;
  iVar1 = xmlStringCurrentChar(ctxt,pxVar7,&l);
  iVar2 = xmlIsNameStartChar(ctxt,iVar1);
  if (iVar2 == 0) {
LAB_0015a551:
    __dest = (xmlChar *)0x0;
  }
  else {
    local_b0 = str;
    if (l == 1) {
      buf[0] = (xmlChar)iVar1;
      __n = 1;
      lVar3 = 1;
    }
    else {
      uVar5 = xmlCopyCharMultiByte(buf,iVar1);
      __n = (ulong)uVar5;
      lVar3 = (long)l;
    }
    pxVar7 = pxVar7 + lVar3;
    iVar1 = xmlStringCurrentChar(ctxt,pxVar7,&l);
    do {
      iVar2 = xmlIsNameChar(ctxt,iVar1);
      iVar6 = (int)__n;
      if (iVar2 == 0) {
        if ((iVar6 < 0xc351) || ((ctxt->options & 0x80000) != 0)) {
          *local_b0 = pxVar7;
          pxVar7 = xmlStrndup(buf,iVar6);
          return pxVar7;
        }
        xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
        goto LAB_0015a551;
      }
      if (l == 1) {
        uVar5 = iVar6 + 1;
        buf[iVar6] = (xmlChar)iVar1;
        lVar3 = 1;
      }
      else {
        iVar1 = xmlCopyCharMultiByte(buf + iVar6,iVar1);
        uVar5 = iVar6 + iVar1;
        lVar3 = (long)l;
      }
      __n = (ulong)uVar5;
      pxVar7 = pxVar7 + lVar3;
      iVar1 = xmlStringCurrentChar(ctxt,pxVar7,&l);
    } while ((int)uVar5 < 100);
    local_b8 = (ulong)(uVar5 * 2);
    __dest = (xmlChar *)(*xmlMallocAtomic)(local_b8);
    if (__dest == (xmlChar *)0x0) {
      __dest = (xmlChar *)0x0;
      xmlErrMemory(ctxt,(char *)0x0);
    }
    else {
      memcpy(__dest,buf,__n);
      while( true ) {
        iVar2 = xmlIsNameChar(ctxt,iVar1);
        iVar6 = (int)__n;
        if (iVar2 == 0) break;
        pxVar4 = __dest;
        if ((int)local_b8 < iVar6 + 10) {
          if ((iVar6 < 0xc351) || ((ctxt->options & 0x80000) != 0)) {
            local_b8 = (ulong)(uint)((int)local_b8 * 2);
            pxVar4 = (xmlChar *)(*xmlRealloc)(__dest,local_b8);
            if (pxVar4 != (xmlChar *)0x0) goto LAB_0015a481;
            xmlErrMemory(ctxt,(char *)0x0);
          }
          else {
            xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
          }
          (*xmlFree)(__dest);
          goto LAB_0015a551;
        }
LAB_0015a481:
        if (l == 1) {
          uVar5 = iVar6 + 1;
          pxVar4[iVar6] = (xmlChar)iVar1;
        }
        else {
          iVar1 = xmlCopyCharMultiByte(pxVar4 + iVar6,iVar1);
          uVar5 = iVar1 + iVar6;
        }
        __n = (ulong)uVar5;
        pxVar7 = pxVar7 + l;
        iVar1 = xmlStringCurrentChar(ctxt,pxVar7,&l);
        __dest = pxVar4;
      }
      __dest[iVar6] = '\0';
      *local_b0 = pxVar7;
    }
  }
  return __dest;
}

Assistant:

static xmlChar *
xmlParseStringName(xmlParserCtxtPtr ctxt, const xmlChar** str) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    const xmlChar *cur = *str;
    int len = 0, l;
    int c;

#ifdef DEBUG
    nbParseStringName++;
#endif

    c = CUR_SCHAR(cur, l);
    if (!xmlIsNameStartChar(ctxt, c)) {
	return(NULL);
    }

    COPY_BUF(l,buf,len,c);
    cur += l;
    c = CUR_SCHAR(cur, l);
    while (xmlIsNameChar(ctxt, c)) {
	COPY_BUF(l,buf,len,c);
	cur += l;
	c = CUR_SCHAR(cur, l);
	if (len >= XML_MAX_NAMELEN) { /* test bigentname.xml */
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = (xmlChar *) xmlMallocAtomic(max * sizeof(xmlChar));
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (len + 10 > max) {
		    xmlChar *tmp;

                    if ((len > XML_MAX_NAME_LENGTH) &&
                        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
			xmlFree(buffer);
                        return(NULL);
                    }
		    max *= 2;
		    tmp = (xmlChar *) xmlRealloc(buffer,
			                            max * sizeof(xmlChar));
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
		}
		COPY_BUF(l,buffer,len,c);
		cur += l;
		c = CUR_SCHAR(cur, l);
	    }
	    buffer[len] = 0;
	    *str = cur;
	    return(buffer);
	}
    }
    if ((len > XML_MAX_NAME_LENGTH) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
        return(NULL);
    }
    *str = cur;
    return(xmlStrndup(buf, len));
}